

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O2

void __thiscall
Js::ArrayBuffer::ArrayBuffer
          (ArrayBuffer *this,RefCountedBuffer *buffContent,uint32 length,DynamicType *type)

{
  bool bVar1;
  Recycler *this_00;
  
  ArrayBufferBase::ArrayBufferBase(&this->super_ArrayBufferBase,type);
  (this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_0138c908;
  this->bufferContent = (Type)0x0;
  (this->primaryParent).ptr = (RecyclerWeakReference<Js::ArrayBufferParent> *)0x0;
  (this->otherParents).ptr = (OtherParents *)0x0;
  this->bufferLength = length;
  if ((int)length < 0) {
    JavascriptError::ThrowTypeError
              ((((((this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.type.ptr
                  )->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
               -0x7ff5ec37,(PCWSTR)0x0);
  }
  this_00 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  bVar1 = Memory::Recycler::RequestExternalMemoryAllocation(this_00,(ulong)length);
  if (bVar1) {
    this->bufferContent = buffContent;
    if (buffContent != (RefCountedBuffer *)0x0) {
      RefCountedBuffer::AddRef(buffContent);
      return;
    }
    return;
  }
  JavascriptError::ThrowOutOfMemoryError
            ((((((this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.type.ptr)
               ->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
}

Assistant:

ArrayBuffer::ArrayBuffer(RefCountedBuffer* buffContent, uint32 length, DynamicType * type)
       : bufferContent(nullptr), bufferLength(length), ArrayBufferBase(type)
    {
        if (length > MaxArrayBufferLength)
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_FunctionArgument_Invalid);
        }

        // we take the ownership of the buffer and will have to free it so charge it to our quota.
        if (!this->GetRecycler()->RequestExternalMemoryAllocation(length))
        {
            JavascriptError::ThrowOutOfMemoryError(this->GetScriptContext());
        }

        this->bufferContent = buffContent;

        // The bufferContent can be null as might have detached an ArrayBuffer which does not have bufferContent.
        if (this->bufferContent != nullptr)
        {
            this->bufferContent->AddRef();
        }
    }